

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall
soul::StructuralParser::parseLocalLetOrVar(StructuralParser *this,bool isConst)

{
  Statement *pSVar1;
  anon_class_8_1_8991fb9c local_10;
  
  local_10.this = this;
  parseLetOrVarDeclaration<soul::StructuralParser::parseLocalLetOrVar(bool)::_lambda(soul::AST::VariableDeclaration&)_1_>
            (this,isConst,&local_10);
  pSVar1 = getNoop(this);
  return pSVar1;
}

Assistant:

AST::Statement& parseLocalLetOrVar (bool isConst)
    {
        parseLetOrVarDeclaration (isConst, [this] (AST::VariableDeclaration& v)
        {
            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = IdentifierPath (v.name);
            search.stopAtFirstScopeWithResults = true;
            search.findTypes = false;
            search.findFunctions = false;
            search.findNamespaces = false;
            search.findProcessors = false;
            search.findProcessorInstances = false;
            search.findEndpoints = false;
            search.onlyFindLocalVariables = true;

            auto& currentBlock = getCurrentBlock();
            currentBlock.performFullNameSearch (search, nullptr);
            currentBlock.addStatement (v);

            if (! search.itemsFound.empty())
                v.context.location.emitMessage (Warnings::localVariableShadow (v.name));
        });

        return getNoop();
    }